

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

int __thiscall
Analysis::LexicalAnalysis::ReadFile(LexicalAnalysis *this,vector<char,_std::allocator<char>_> *Code)

{
  char cVar1;
  istream *piVar2;
  LexicalAnalysis *this_00;
  string line;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + (char)this);
    this_00 = this;
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)this,(string *)&local_40,cVar1);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    TokenizeLine(this_00,&local_40,Code);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int LexicalAnalysis::ReadFile(std::vector<char> &Code) {

        std::string line;

        //read the file line by line
        while (std::getline(file, line)) {
            TokenizeLine(line, Code);
        }
        return 0;
    }